

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optional.h
# Opt level: O2

void __thiscall
llvm::optional_detail::OptionalStorage<llvm::DWARFDebugNames::Entry,_false>::OptionalStorage
          (OptionalStorage<llvm::DWARFDebugNames::Entry,_false> *this,
          OptionalStorage<llvm::DWARFDebugNames::Entry,_false> *other)

{
  (this->field_0).empty = '\0';
  this->hasVal = false;
  if (other->hasVal == true) {
    OptionalStorage<llvm::DWARFDebugNames::Entry,false>::
    emplace<llvm::DWARFDebugNames::Entry_const&>
              ((OptionalStorage<llvm::DWARFDebugNames::Entry,false> *)this,(Entry *)other);
  }
  return;
}

Assistant:

OptionalStorage(OptionalStorage const &other) : OptionalStorage() {
    if (other.hasValue()) {
      emplace(other.value);
    }
  }